

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_sad_avx2.c
# Opt level: O0

uint obmc_sad_w4_avx2(uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,int height)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  uint uVar4;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  longlong lVar5;
  void *in_RDI;
  void *a;
  int in_R8D;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  __m128i v_d;
  __m128i v_sad_d_1;
  __m128i v_sad_d_0;
  __m256i v_rad_d;
  __m256i v_tmp_d;
  __m256i v_absdiff_d;
  __m256i v_diff_d;
  __m256i v_pm_d;
  __m256i v_p_d;
  __m256i v_w_d;
  __m256i v_m_d;
  __m128i v_p_b;
  __m128i v_p_b_1;
  __m128i v_p_b_0;
  __m256i v_bias_d;
  __m256i v_sad_d;
  int n;
  undefined8 local_350;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined4 local_2c8;
  undefined8 local_2a8;
  
  local_2c8 = 0;
  local_300 = ZEXT1632(ZEXT816(0));
  lVar5 = 0x800;
  auVar7 = vpinsrd_avx(ZEXT416(0x800),0x800,1);
  auVar7 = vpinsrd_avx(auVar7,0x800,2);
  auVar7 = vpinsrd_avx(auVar7,0x800,3);
  auVar6 = vpinsrd_avx(ZEXT416(0x800),0x800,1);
  auVar6 = vpinsrd_avx(auVar6,0x800,2);
  auVar6 = vpinsrd_avx(auVar6,0x800,3);
  auVar8._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar6;
  auVar8._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar7;
  auVar1 = auVar8;
  local_2a8 = in_RDI;
  do {
    auVar6 = auVar1._0_16_;
    xx_loadl_32(local_2a8);
    a = (void *)((long)local_2a8 + (long)in_ESI);
    auVar7 = auVar6;
    xx_loadl_32(a);
    auVar7 = vpunpckldq_avx(auVar6,auVar7);
    auVar1 = vlddqu_avx(*(undefined1 (*) [32])(in_RCX + (long)local_2c8 * 4));
    auVar2 = vlddqu_avx(*(undefined1 (*) [32])(in_RDX + (long)local_2c8 * 4));
    local_350 = auVar7._0_8_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_350;
    auVar3 = vpmovzxbd_avx2(auVar7);
    auVar1 = vpmaddwd_avx2(auVar3,auVar1);
    auVar1 = vpsubd_avx2(auVar2,auVar1);
    auVar1 = vpabsd_avx2(auVar1);
    uStack_310 = auVar8._16_8_;
    uStack_308 = auVar8._24_8_;
    auVar2._16_8_ = uStack_310;
    auVar2._0_16_ = auVar8._0_16_;
    auVar2._24_8_ = uStack_308;
    auVar1 = vpaddd_avx2(auVar1,auVar2);
    auVar1 = vpsrld_avx2(auVar1,ZEXT416(0xc));
    auVar1 = vpaddd_avx2(local_300,auVar1);
    local_2c8 = local_2c8 + 8;
    local_2a8 = (void *)((long)local_2a8 + (long)(in_ESI << 1));
    local_300 = auVar1;
  } while (local_2c8 < (in_R8D >> 1) * 8);
  vpaddd_avx(auVar1._0_16_,auVar1._16_16_);
  v_d[1] = lVar5;
  v_d[0] = (longlong)a;
  uVar4 = xx_hsum_epi32_si32(v_d);
  return uVar4;
}

Assistant:

static inline unsigned int obmc_sad_w4_avx2(const uint8_t *pre,
                                            const int pre_stride,
                                            const int32_t *wsrc,
                                            const int32_t *mask,
                                            const int height) {
  int n = 0;
  __m256i v_sad_d = _mm256_setzero_si256();
  const __m256i v_bias_d = _mm256_set1_epi32((1 << 12) >> 1);

  do {
    const __m128i v_p_b_0 = xx_loadl_32(pre);
    const __m128i v_p_b_1 = xx_loadl_32(pre + pre_stride);
    const __m128i v_p_b = _mm_unpacklo_epi32(v_p_b_0, v_p_b_1);
    const __m256i v_m_d = _mm256_lddqu_si256((__m256i *)(mask + n));
    const __m256i v_w_d = _mm256_lddqu_si256((__m256i *)(wsrc + n));

    const __m256i v_p_d = _mm256_cvtepu8_epi32(v_p_b);

    // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
    // boundaries. We use pmaddwd, as it has lower latency on Haswell
    // than pmulld but produces the same result with these inputs.
    const __m256i v_pm_d = _mm256_madd_epi16(v_p_d, v_m_d);

    const __m256i v_diff_d = _mm256_sub_epi32(v_w_d, v_pm_d);
    const __m256i v_absdiff_d = _mm256_abs_epi32(v_diff_d);

    // Rounded absolute difference
    const __m256i v_tmp_d = _mm256_add_epi32(v_absdiff_d, v_bias_d);
    const __m256i v_rad_d = _mm256_srli_epi32(v_tmp_d, 12);

    v_sad_d = _mm256_add_epi32(v_sad_d, v_rad_d);

    n += 8;
    pre += pre_stride << 1;
  } while (n < 8 * (height >> 1));

  __m128i v_sad_d_0 = _mm256_castsi256_si128(v_sad_d);
  __m128i v_sad_d_1 = _mm256_extracti128_si256(v_sad_d, 1);
  v_sad_d_0 = _mm_add_epi32(v_sad_d_0, v_sad_d_1);
  return xx_hsum_epi32_si32(v_sad_d_0);
}